

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Discoverer.cpp
# Opt level: O0

void __thiscall
new_words_discover::Discoverer::calculate_firmness
          (Discoverer *this,
          pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>
          *word)

{
  size_t sVar1;
  unsigned_long uVar2;
  double *pdVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  unsigned_long *puVar6;
  long lVar7;
  undefined4 uVar8;
  double dVar9;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double ans;
  tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>
  *local_70;
  mapped_type *right_part;
  key_type local_58;
  mapped_type *local_38;
  mapped_type *left_part;
  size_t i;
  double min_firmness;
  size_t p_word;
  pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>
  *word_local;
  Discoverer *this_local;
  undefined1 auVar10 [16];
  
  p_word = (size_t)word;
  word_local = (pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>
                *)this;
  pdVar3 = (double *)
           std::
           get<unsigned_long,unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>
                     (&word->second);
  min_firmness = *pdVar3;
  i = (size_t)std::numeric_limits<double>::max();
  left_part = (mapped_type *)0x0;
  while( true ) {
    pmVar5 = left_part;
    pmVar4 = (mapped_type *)std::__cxx11::wstring::size();
    sVar1 = i;
    if (pmVar4 <= pmVar5) break;
    std::__cxx11::wstring::substr((ulong)&local_58,p_word);
    pmVar5 = std::
             unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
             ::operator[](&this->words_,&local_58);
    std::__cxx11::wstring::~wstring((wstring *)&local_58);
    sVar1 = p_word;
    local_38 = pmVar5;
    std::__cxx11::wstring::size();
    std::__cxx11::wstring::substr((ulong)&ans,sVar1);
    pmVar5 = std::
             unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>_>_>_>
             ::operator[](&this->words_,(key_type *)&ans);
    std::__cxx11::wstring::~wstring((wstring *)&ans);
    auVar10._8_4_ = (int)((ulong)min_firmness >> 0x20);
    auVar10._0_8_ = min_firmness;
    auVar10._12_4_ = 0x45300000;
    uVar8 = SUB84(min_firmness,0);
    sVar1 = this->tot_frequency_;
    auVar11._8_4_ = (int)(sVar1 >> 0x20);
    auVar11._0_8_ = sVar1;
    auVar11._12_4_ = 0x45300000;
    local_70 = pmVar5;
    puVar6 = std::
             get<unsigned_long,unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>
                       (local_38);
    uVar2 = *puVar6;
    puVar6 = std::
             get<unsigned_long,unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>
                       (local_70);
    lVar7 = uVar2 * *puVar6;
    auVar12._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar12._0_8_ = lVar7;
    auVar12._12_4_ = 0x45300000;
    dVar9 = (((auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar8) - 4503599627370496.0)) *
            ((auVar11._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0))) /
            ((auVar12._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
    if (dVar9 < (double)i) {
      i = (size_t)dVar9;
    }
    left_part = (mapped_type *)
                ((long)&(left_part->
                        super__Tuple_impl<0UL,_unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>
                        ).
                        super__Tuple_impl<1UL,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>
                        .
                        super__Tuple_impl<2UL,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>
                        .super__Tuple_impl<3UL,_double>.super__Head_base<3UL,_double,_false>.
                        _M_head_impl + 1);
  }
  pdVar3 = std::
           get<double,unsigned_long,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,std::unordered_map<wchar_t,unsigned_long,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,unsigned_long>>>,double>
                     ((tuple<unsigned_long,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_std::unordered_map<wchar_t,_unsigned_long,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_unsigned_long>_>_>,_double>
                       *)(p_word + 0x20));
  *pdVar3 = (double)sVar1;
  return;
}

Assistant:

void Discoverer::calculate_firmness(std::pair<const std::wstring, word_t> &word)
{
    size_t p_word = std::get<frequency_t>(word.second);
    double min_firmness = std::numeric_limits<double>::max();

    for (size_t i = 0; i < word.first.size(); ++i) {
        const auto &left_part = words_[word.first.substr(0, i + 1)];
        const auto &right_part = words_[word.first.substr(i + 1, word.first.size() - i - 1)];
        auto ans = static_cast<double>(p_word) * tot_frequency_ /
                   (std::get<frequency_t>(left_part) * std::get<frequency_t>(right_part));
        if (ans < min_firmness) {
            min_firmness = ans;
        }
    }
    std::get<firmness_t>(word.second) = min_firmness;
}